

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_start_seq(Parser *this,bool as_child)

{
  uint uVar1;
  State *pSVar2;
  ulong uVar3;
  Tree *this_00;
  code *pcVar4;
  Location LVar5;
  undefined1 auVar6 [24];
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  bool bVar11;
  NodeData *pNVar12;
  size_t *psVar13;
  size_t sVar14;
  long lVar15;
  char *pcVar16;
  char *pcVar17;
  Tree *pTVar18;
  NodeData *pNVar19;
  ulong uVar20;
  NodeType_e NVar21;
  byte bVar22;
  csubstr cVar23;
  csubstr tag;
  char msg [58];
  char local_148 [72];
  undefined4 local_100;
  undefined1 local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  bVar22 = 0;
  pSVar2 = this->m_state;
  if ((~pSVar2->flags & 3U) == 0) {
    sVar14 = (this->m_key_tag).len;
    (this->m_val_tag).str = (this->m_key_tag).str;
    (this->m_val_tag).len = sVar14;
    (this->m_key_tag).str = (char *)0x0;
    (this->m_key_tag).len = 0;
  }
  pSVar2->flags = pSVar2->flags & 0xffffff75U | 0x88;
  if ((this->m_stack).m_size == 0) {
    if ((s_error_flags & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    local_148[0] = '\0';
    local_148[1] = '\0';
    local_148[2] = '\0';
    local_148[3] = '\0';
    local_148[4] = '\0';
    local_148[5] = '\0';
    local_148[6] = '\0';
    local_148[7] = '\0';
    local_148[8] = '_';
    local_148[9] = '\\';
    local_148[10] = '\0';
    local_148[0xb] = '\0';
    local_148[0xc] = '\0';
    local_148[0xd] = '\0';
    local_148[0xe] = '\0';
    local_148[0xf] = '\0';
    local_148[0x10] = '\0';
    local_148[0x11] = '\0';
    local_148[0x12] = '\0';
    local_148[0x13] = '\0';
    local_148[0x14] = '\0';
    local_148[0x15] = '\0';
    local_148[0x16] = '\0';
    local_148[0x17] = '\0';
    local_148[0x18] = -0x66;
    local_148[0x19] = -0x21;
    local_148[0x1a] = '\x1f';
    local_148[0x1b] = '\0';
    local_148[0x1c] = '\0';
    local_148[0x1d] = '\0';
    local_148[0x1e] = '\0';
    local_148[0x1f] = '\0';
    local_148[0x20] = 'e';
    local_148[0x21] = '\0';
    local_148[0x22] = '\0';
    local_148[0x23] = '\0';
    local_148[0x24] = '\0';
    local_148[0x25] = '\0';
    local_148[0x26] = '\0';
    local_148[0x27] = '\0';
    (*(code *)PTR_error_impl_00240518)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
  }
  uVar20 = ((this->m_stack).m_stack)->node_id;
  if (uVar20 == 0xffffffffffffffff) {
    pNVar19 = (NodeData *)0x0;
  }
  else {
    pTVar18 = this->m_tree;
    if (pTVar18->m_cap <= uVar20) {
      if ((s_error_flags & 1) != 0) {
        bVar11 = is_debugger_attached();
        if (bVar11) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      local_148[0] = '\0';
      local_148[1] = '\0';
      local_148[2] = '\0';
      local_148[3] = '\0';
      local_148[4] = '\0';
      local_148[5] = '\0';
      local_148[6] = '\0';
      local_148[7] = '\0';
      local_148[8] = 't';
      local_148[9] = 'K';
      local_148[10] = '\0';
      local_148[0xb] = '\0';
      local_148[0xc] = '\0';
      local_148[0xd] = '\0';
      local_148[0xe] = '\0';
      local_148[0xf] = '\0';
      local_148[0x10] = '\0';
      local_148[0x11] = '\0';
      local_148[0x12] = '\0';
      local_148[0x13] = '\0';
      local_148[0x14] = '\0';
      local_148[0x15] = '\0';
      local_148[0x16] = '\0';
      local_148[0x17] = '\0';
      local_148[0x18] = -0x66;
      local_148[0x19] = -0x21;
      local_148[0x1a] = '\x1f';
      local_148[0x1b] = '\0';
      local_148[0x1c] = '\0';
      local_148[0x1d] = '\0';
      local_148[0x1e] = '\0';
      local_148[0x1f] = '\0';
      local_148[0x20] = 'e';
      local_148[0x21] = '\0';
      local_148[0x22] = '\0';
      local_148[0x23] = '\0';
      local_148[0x24] = '\0';
      local_148[0x25] = '\0';
      local_148[0x26] = '\0';
      local_148[0x27] = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    pNVar19 = pTVar18->m_buf + uVar20;
  }
  uVar20 = this->m_root_id;
  if (uVar20 == 0xffffffffffffffff) {
    pNVar12 = (NodeData *)0x0;
  }
  else {
    pTVar18 = this->m_tree;
    if (pTVar18->m_cap <= uVar20) {
      if ((s_error_flags & 1) != 0) {
        bVar11 = is_debugger_attached();
        if (bVar11) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      local_148[0] = '\0';
      local_148[1] = '\0';
      local_148[2] = '\0';
      local_148[3] = '\0';
      local_148[4] = '\0';
      local_148[5] = '\0';
      local_148[6] = '\0';
      local_148[7] = '\0';
      local_148[8] = 't';
      local_148[9] = 'K';
      local_148[10] = '\0';
      local_148[0xb] = '\0';
      local_148[0xc] = '\0';
      local_148[0xd] = '\0';
      local_148[0xe] = '\0';
      local_148[0xf] = '\0';
      local_148[0x10] = '\0';
      local_148[0x11] = '\0';
      local_148[0x12] = '\0';
      local_148[0x13] = '\0';
      local_148[0x14] = '\0';
      local_148[0x15] = '\0';
      local_148[0x16] = '\0';
      local_148[0x17] = '\0';
      local_148[0x18] = -0x66;
      local_148[0x19] = -0x21;
      local_148[0x1a] = '\x1f';
      local_148[0x1b] = '\0';
      local_148[0x1c] = '\0';
      local_148[0x1d] = '\0';
      local_148[0x1e] = '\0';
      local_148[0x1f] = '\0';
      local_148[0x20] = 'e';
      local_148[0x21] = '\0';
      local_148[0x22] = '\0';
      local_148[0x23] = '\0';
      local_148[0x24] = '\0';
      local_148[0x25] = '\0';
      local_148[0x26] = '\0';
      local_148[0x27] = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    pNVar12 = pTVar18->m_buf + uVar20;
  }
  if (pNVar19 != pNVar12) {
    builtin_strncpy(local_148 + 0x30,"root_id))",10);
    builtin_strncpy(local_148 + 0x20,"om()) == node(m_",0x10);
    builtin_strncpy(local_148 + 0x10,"ode(m_stack.bott",0x10);
    builtin_strncpy(local_148,"check failed: (n",0x10);
    if ((s_error_flags & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    local_58 = 0;
    uStack_50 = 0x7883;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    auVar6 = ZEXT1224(ZEXT412(0x7883) << 0x40);
    LVar5.name.str._0_4_ = 0x1fdf9a;
    LVar5.super_LineCol.offset = auVar6._0_8_;
    LVar5.super_LineCol.line = auVar6._8_8_;
    LVar5.super_LineCol.col = auVar6._16_8_;
    LVar5.name.str._4_4_ = 0;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_148,0x3a,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar20 = (this->m_stack).m_size;
  psVar13 = &(this->m_stack).m_stack[uVar20 - 2].node_id;
  if (uVar20 < 2) {
    psVar13 = &this->m_root_id;
  }
  uVar20 = *psVar13;
  if (uVar20 == 0xffffffffffffffff) {
    builtin_strncpy(local_148,"check failed: (parent_id != NONE)",0x22);
    if ((s_error_flags & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    local_80 = 0;
    uStack_78 = 0x7885;
    local_70 = 0;
    pcStack_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_60 = 0x65;
    auVar6 = ZEXT1224(ZEXT412(0x7885) << 0x40);
    LVar7.name.str._0_4_ = 0x1fdf9a;
    LVar7.super_LineCol.offset = auVar6._0_8_;
    LVar7.super_LineCol.line = auVar6._8_8_;
    LVar7.super_LineCol.col = auVar6._16_8_;
    LVar7.name.str._4_4_ = 0;
    LVar7.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_148,0x22,LVar7,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar3 = this->m_state->node_id;
  if (uVar3 != 0xffffffffffffffff) {
    pTVar18 = this->m_tree;
    if (pTVar18->m_cap <= uVar3) {
      if ((s_error_flags & 1) != 0) {
        bVar11 = is_debugger_attached();
        if (bVar11) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      local_148[0] = '\0';
      local_148[1] = '\0';
      local_148[2] = '\0';
      local_148[3] = '\0';
      local_148[4] = '\0';
      local_148[5] = '\0';
      local_148[6] = '\0';
      local_148[7] = '\0';
      local_148[8] = 't';
      local_148[9] = 'K';
      local_148[10] = '\0';
      local_148[0xb] = '\0';
      local_148[0xc] = '\0';
      local_148[0xd] = '\0';
      local_148[0xe] = '\0';
      local_148[0xf] = '\0';
      local_148[0x10] = '\0';
      local_148[0x11] = '\0';
      local_148[0x12] = '\0';
      local_148[0x13] = '\0';
      local_148[0x14] = '\0';
      local_148[0x15] = '\0';
      local_148[0x16] = '\0';
      local_148[0x17] = '\0';
      local_148[0x18] = -0x66;
      local_148[0x19] = -0x21;
      local_148[0x1a] = '\x1f';
      local_148[0x1b] = '\0';
      local_148[0x1c] = '\0';
      local_148[0x1d] = '\0';
      local_148[0x1e] = '\0';
      local_148[0x1f] = '\0';
      local_148[0x20] = 'e';
      local_148[0x21] = '\0';
      local_148[0x22] = '\0';
      local_148[0x23] = '\0';
      local_148[0x24] = '\0';
      local_148[0x25] = '\0';
      local_148[0x26] = '\0';
      local_148[0x27] = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    if (pTVar18->m_buf != (NodeData *)0x0) {
      uVar3 = this->m_state->node_id;
      if (uVar3 == 0xffffffffffffffff) {
        pNVar19 = (NodeData *)0x0;
      }
      else {
        pTVar18 = this->m_tree;
        if (pTVar18->m_cap <= uVar3) {
          if ((s_error_flags & 1) != 0) {
            bVar11 = is_debugger_attached();
            if (bVar11) {
              pcVar4 = (code *)swi(3);
              (*pcVar4)();
              return;
            }
          }
          local_148[0] = '\0';
          local_148[1] = '\0';
          local_148[2] = '\0';
          local_148[3] = '\0';
          local_148[4] = '\0';
          local_148[5] = '\0';
          local_148[6] = '\0';
          local_148[7] = '\0';
          local_148[8] = 't';
          local_148[9] = 'K';
          local_148[10] = '\0';
          local_148[0xb] = '\0';
          local_148[0xc] = '\0';
          local_148[0xd] = '\0';
          local_148[0xe] = '\0';
          local_148[0xf] = '\0';
          local_148[0x10] = '\0';
          local_148[0x11] = '\0';
          local_148[0x12] = '\0';
          local_148[0x13] = '\0';
          local_148[0x14] = '\0';
          local_148[0x15] = '\0';
          local_148[0x16] = '\0';
          local_148[0x17] = '\0';
          local_148[0x18] = -0x66;
          local_148[0x19] = -0x21;
          local_148[0x1a] = '\x1f';
          local_148[0x1b] = '\0';
          local_148[0x1c] = '\0';
          local_148[0x1d] = '\0';
          local_148[0x1e] = '\0';
          local_148[0x1f] = '\0';
          local_148[0x20] = 'e';
          local_148[0x21] = '\0';
          local_148[0x22] = '\0';
          local_148[0x23] = '\0';
          local_148[0x24] = '\0';
          local_148[0x25] = '\0';
          local_148[0x26] = '\0';
          local_148[0x27] = '\0';
          (*(code *)PTR_error_impl_00240518)
                    ("check failed: i >= 0 && i < m_cap",0x21,
                     (anonymous_namespace)::s_default_callbacks);
        }
        pNVar19 = pTVar18->m_buf + uVar3;
      }
      uVar3 = this->m_root_id;
      if (uVar3 == 0xffffffffffffffff) {
        pNVar12 = (NodeData *)0x0;
      }
      else {
        pTVar18 = this->m_tree;
        if (pTVar18->m_cap <= uVar3) {
          if ((s_error_flags & 1) != 0) {
            bVar11 = is_debugger_attached();
            if (bVar11) {
              pcVar4 = (code *)swi(3);
              (*pcVar4)();
              return;
            }
          }
          local_148[0] = '\0';
          local_148[1] = '\0';
          local_148[2] = '\0';
          local_148[3] = '\0';
          local_148[4] = '\0';
          local_148[5] = '\0';
          local_148[6] = '\0';
          local_148[7] = '\0';
          local_148[8] = 't';
          local_148[9] = 'K';
          local_148[10] = '\0';
          local_148[0xb] = '\0';
          local_148[0xc] = '\0';
          local_148[0xd] = '\0';
          local_148[0xe] = '\0';
          local_148[0xf] = '\0';
          local_148[0x10] = '\0';
          local_148[0x11] = '\0';
          local_148[0x12] = '\0';
          local_148[0x13] = '\0';
          local_148[0x14] = '\0';
          local_148[0x15] = '\0';
          local_148[0x16] = '\0';
          local_148[0x17] = '\0';
          local_148[0x18] = -0x66;
          local_148[0x19] = -0x21;
          local_148[0x1a] = '\x1f';
          local_148[0x1b] = '\0';
          local_148[0x1c] = '\0';
          local_148[0x1d] = '\0';
          local_148[0x1e] = '\0';
          local_148[0x1f] = '\0';
          local_148[0x20] = 'e';
          local_148[0x21] = '\0';
          local_148[0x22] = '\0';
          local_148[0x23] = '\0';
          local_148[0x24] = '\0';
          local_148[0x25] = '\0';
          local_148[0x26] = '\0';
          local_148[0x27] = '\0';
          (*(code *)PTR_error_impl_00240518)
                    ("check failed: i >= 0 && i < m_cap",0x21,
                     (anonymous_namespace)::s_default_callbacks);
        }
        pNVar12 = pTVar18->m_buf + uVar3;
      }
      if (pNVar19 != pNVar12) {
        pcVar16 = "check failed: (node(m_state) == nullptr || node(m_state) == node(m_root_id))";
        pcVar17 = local_148;
        for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
          *(undefined8 *)pcVar17 = *(undefined8 *)pcVar16;
          pcVar16 = pcVar16 + ((ulong)bVar22 * -2 + 1) * 8;
          pcVar17 = pcVar17 + ((ulong)bVar22 * -2 + 1) * 8;
        }
        local_fc = 0;
        local_100 = 0x29296469;
        if ((s_error_flags & 1) != 0) {
          bVar11 = is_debugger_attached();
          if (bVar11) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
        }
        local_a8 = 0;
        uStack_a0 = 0x7886;
        local_98 = 0;
        pcStack_90 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_88 = 0x65;
        auVar6 = ZEXT1224(ZEXT412(0x7886) << 0x40);
        LVar8.name.str._0_4_ = 0x1fdf9a;
        LVar8.super_LineCol.offset = auVar6._0_8_;
        LVar8.super_LineCol.line = auVar6._8_8_;
        LVar8.super_LineCol.col = auVar6._16_8_;
        LVar8.name.str._4_4_ = 0;
        LVar8.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  (local_148,0x4d,LVar8,(this->m_stack).m_callbacks.m_user_data);
      }
    }
  }
  if (as_child) {
    pTVar18 = this->m_tree;
    if ((uVar20 == 0xffffffffffffffff) || (pTVar18->m_cap <= uVar20)) {
      if ((s_error_flags & 1) != 0) {
        bVar11 = is_debugger_attached();
        if (bVar11) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      local_148[0] = '\0';
      local_148[1] = '\0';
      local_148[2] = '\0';
      local_148[3] = '\0';
      local_148[4] = '\0';
      local_148[5] = '\0';
      local_148[6] = '\0';
      local_148[7] = '\0';
      local_148[8] = -0x7d;
      local_148[9] = 'K';
      local_148[10] = '\0';
      local_148[0xb] = '\0';
      local_148[0xc] = '\0';
      local_148[0xd] = '\0';
      local_148[0xe] = '\0';
      local_148[0xf] = '\0';
      local_148[0x10] = '\0';
      local_148[0x11] = '\0';
      local_148[0x12] = '\0';
      local_148[0x13] = '\0';
      local_148[0x14] = '\0';
      local_148[0x15] = '\0';
      local_148[0x16] = '\0';
      local_148[0x17] = '\0';
      local_148[0x18] = -0x66;
      local_148[0x19] = -0x21;
      local_148[0x1a] = '\x1f';
      local_148[0x1b] = '\0';
      local_148[0x1c] = '\0';
      local_148[0x1d] = '\0';
      local_148[0x1e] = '\0';
      local_148[0x1f] = '\0';
      local_148[0x20] = 'e';
      local_148[0x21] = '\0';
      local_148[0x22] = '\0';
      local_148[0x23] = '\0';
      local_148[0x24] = '\0';
      local_148[0x25] = '\0';
      local_148[0x26] = '\0';
      local_148[0x27] = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    uVar3 = pTVar18->m_buf[uVar20].m_last_child;
    if (uVar20 == 0xffffffffffffffff) {
      if ((s_error_flags & 1) != 0) {
        bVar11 = is_debugger_attached();
        if (bVar11) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      local_148[0] = '\0';
      local_148[1] = '\0';
      local_148[2] = '\0';
      local_148[3] = '\0';
      local_148[4] = '\0';
      local_148[5] = '\0';
      local_148[6] = '\0';
      local_148[7] = '\0';
      local_148[8] = -0x4f;
      local_148[9] = 'L';
      local_148[10] = '\0';
      local_148[0xb] = '\0';
      local_148[0xc] = '\0';
      local_148[0xd] = '\0';
      local_148[0xe] = '\0';
      local_148[0xf] = '\0';
      local_148[0x10] = '\0';
      local_148[0x11] = '\0';
      local_148[0x12] = '\0';
      local_148[0x13] = '\0';
      local_148[0x14] = '\0';
      local_148[0x15] = '\0';
      local_148[0x16] = '\0';
      local_148[0x17] = '\0';
      local_148[0x18] = -0x66;
      local_148[0x19] = -0x21;
      local_148[0x1a] = '\x1f';
      local_148[0x1b] = '\0';
      local_148[0x1c] = '\0';
      local_148[0x1d] = '\0';
      local_148[0x1e] = '\0';
      local_148[0x1f] = '\0';
      local_148[0x20] = 'e';
      local_148[0x21] = '\0';
      local_148[0x22] = '\0';
      local_148[0x23] = '\0';
      local_148[0x24] = '\0';
      local_148[0x25] = '\0';
      local_148[0x26] = '\0';
      local_148[0x27] = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
    }
    if ((uVar20 == 0xffffffffffffffff) || (pTVar18->m_cap <= uVar20)) {
      if ((s_error_flags & 1) != 0) {
        bVar11 = is_debugger_attached();
        if (bVar11) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      local_148[0] = '\0';
      local_148[1] = '\0';
      local_148[2] = '\0';
      local_148[3] = '\0';
      local_148[4] = '\0';
      local_148[5] = '\0';
      local_148[6] = '\0';
      local_148[7] = '\0';
      local_148[8] = -0x7a;
      local_148[9] = 'K';
      local_148[10] = '\0';
      local_148[0xb] = '\0';
      local_148[0xc] = '\0';
      local_148[0xd] = '\0';
      local_148[0xe] = '\0';
      local_148[0xf] = '\0';
      local_148[0x10] = '\0';
      local_148[0x11] = '\0';
      local_148[0x12] = '\0';
      local_148[0x13] = '\0';
      local_148[0x14] = '\0';
      local_148[0x15] = '\0';
      local_148[0x16] = '\0';
      local_148[0x17] = '\0';
      local_148[0x18] = -0x66;
      local_148[0x19] = -0x21;
      local_148[0x1a] = '\x1f';
      local_148[0x1b] = '\0';
      local_148[0x1c] = '\0';
      local_148[0x1d] = '\0';
      local_148[0x1e] = '\0';
      local_148[0x1f] = '\0';
      local_148[0x20] = 'e';
      local_148[0x21] = '\0';
      local_148[0x22] = '\0';
      local_148[0x23] = '\0';
      local_148[0x24] = '\0';
      local_148[0x25] = '\0';
      local_148[0x26] = '\0';
      local_148[0x27] = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar18->m_buf[uVar20].m_type.type & (STREAM|MAP)) == NOTYPE) {
      bVar11 = Tree::is_root(pTVar18,uVar20);
      if (!bVar11) {
        if ((s_error_flags & 1) != 0) {
          bVar11 = is_debugger_attached();
          if (bVar11) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
        }
        local_148[0] = '\0';
        local_148[1] = '\0';
        local_148[2] = '\0';
        local_148[3] = '\0';
        local_148[4] = '\0';
        local_148[5] = '\0';
        local_148[6] = '\0';
        local_148[7] = '\0';
        local_148[8] = -0x4e;
        local_148[9] = 'L';
        local_148[10] = '\0';
        local_148[0xb] = '\0';
        local_148[0xc] = '\0';
        local_148[0xd] = '\0';
        local_148[0xe] = '\0';
        local_148[0xf] = '\0';
        local_148[0x10] = '\0';
        local_148[0x11] = '\0';
        local_148[0x12] = '\0';
        local_148[0x13] = '\0';
        local_148[0x14] = '\0';
        local_148[0x15] = '\0';
        local_148[0x16] = '\0';
        local_148[0x17] = '\0';
        local_148[0x18] = -0x66;
        local_148[0x19] = -0x21;
        local_148[0x1a] = '\x1f';
        local_148[0x1b] = '\0';
        local_148[0x1c] = '\0';
        local_148[0x1d] = '\0';
        local_148[0x1e] = '\0';
        local_148[0x1f] = '\0';
        local_148[0x20] = 'e';
        local_148[0x21] = '\0';
        local_148[0x22] = '\0';
        local_148[0x23] = '\0';
        local_148[0x24] = '\0';
        local_148[0x25] = '\0';
        local_148[0x26] = '\0';
        local_148[0x27] = '\0';
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: is_container(parent) || is_root(parent)",0x35,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    if (uVar3 != 0xffffffffffffffff) {
      if (pTVar18->m_cap <= uVar3) {
        if ((s_error_flags & 1) != 0) {
          bVar11 = is_debugger_attached();
          if (bVar11) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
        }
        local_148[0] = '\0';
        local_148[1] = '\0';
        local_148[2] = '\0';
        local_148[3] = '\0';
        local_148[4] = '\0';
        local_148[5] = '\0';
        local_148[6] = '\0';
        local_148[7] = '\0';
        local_148[8] = -0x7d;
        local_148[9] = 'K';
        local_148[10] = '\0';
        local_148[0xb] = '\0';
        local_148[0xc] = '\0';
        local_148[0xd] = '\0';
        local_148[0xe] = '\0';
        local_148[0xf] = '\0';
        local_148[0x10] = '\0';
        local_148[0x11] = '\0';
        local_148[0x12] = '\0';
        local_148[0x13] = '\0';
        local_148[0x14] = '\0';
        local_148[0x15] = '\0';
        local_148[0x16] = '\0';
        local_148[0x17] = '\0';
        local_148[0x18] = -0x66;
        local_148[0x19] = -0x21;
        local_148[0x1a] = '\x1f';
        local_148[0x1b] = '\0';
        local_148[0x1c] = '\0';
        local_148[0x1d] = '\0';
        local_148[0x1e] = '\0';
        local_148[0x1f] = '\0';
        local_148[0x20] = 'e';
        local_148[0x21] = '\0';
        local_148[0x22] = '\0';
        local_148[0x23] = '\0';
        local_148[0x24] = '\0';
        local_148[0x25] = '\0';
        local_148[0x26] = '\0';
        local_148[0x27] = '\0';
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if (pTVar18->m_buf[uVar3].m_parent != uVar20) {
        if ((s_error_flags & 1) != 0) {
          bVar11 = is_debugger_attached();
          if (bVar11) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
        }
        local_148[0] = '\0';
        local_148[1] = '\0';
        local_148[2] = '\0';
        local_148[3] = '\0';
        local_148[4] = '\0';
        local_148[5] = '\0';
        local_148[6] = '\0';
        local_148[7] = '\0';
        local_148[8] = -0x4d;
        local_148[9] = 'L';
        local_148[10] = '\0';
        local_148[0xb] = '\0';
        local_148[0xc] = '\0';
        local_148[0xd] = '\0';
        local_148[0xe] = '\0';
        local_148[0xf] = '\0';
        local_148[0x10] = '\0';
        local_148[0x11] = '\0';
        local_148[0x12] = '\0';
        local_148[0x13] = '\0';
        local_148[0x14] = '\0';
        local_148[0x15] = '\0';
        local_148[0x16] = '\0';
        local_148[0x17] = '\0';
        local_148[0x18] = -0x66;
        local_148[0x19] = -0x21;
        local_148[0x1a] = '\x1f';
        local_148[0x1b] = '\0';
        local_148[0x1c] = '\0';
        local_148[0x1d] = '\0';
        local_148[0x1e] = '\0';
        local_148[0x1f] = '\0';
        local_148[0x20] = 'e';
        local_148[0x21] = '\0';
        local_148[0x22] = '\0';
        local_148[0x23] = '\0';
        local_148[0x24] = '\0';
        local_148[0x25] = '\0';
        local_148[0x26] = '\0';
        local_148[0x27] = '\0';
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    sVar14 = Tree::_claim(pTVar18);
    Tree::_set_hierarchy(pTVar18,sVar14,uVar20,uVar3);
    pSVar2 = this->m_state;
    pSVar2->node_id = sVar14;
    pTVar18 = this->m_tree;
    if ((pSVar2->flags & 0x200) == 0) {
      if ((sVar14 == 0xffffffffffffffff) || (pTVar18->m_cap <= sVar14)) {
        if ((s_error_flags & 1) != 0) {
          bVar11 = is_debugger_attached();
          if (bVar11) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
        }
        local_148[0] = '\0';
        local_148[1] = '\0';
        local_148[2] = '\0';
        local_148[3] = '\0';
        local_148[4] = '\0';
        local_148[5] = '\0';
        local_148[6] = '\0';
        local_148[7] = '\0';
        local_148[8] = -0x7a;
        local_148[9] = 'K';
        local_148[10] = '\0';
        local_148[0xb] = '\0';
        local_148[0xc] = '\0';
        local_148[0xd] = '\0';
        local_148[0xe] = '\0';
        local_148[0xf] = '\0';
        local_148[0x10] = '\0';
        local_148[0x11] = '\0';
        local_148[0x12] = '\0';
        local_148[0x13] = '\0';
        local_148[0x14] = '\0';
        local_148[0x15] = '\0';
        local_148[0x16] = '\0';
        local_148[0x17] = '\0';
        local_148[0x18] = -0x66;
        local_148[0x19] = -0x21;
        local_148[0x1a] = '\x1f';
        local_148[0x1b] = '\0';
        local_148[0x1c] = '\0';
        local_148[0x1d] = '\0';
        local_148[0x1e] = '\0';
        local_148[0x1f] = '\0';
        local_148[0x20] = 'e';
        local_148[0x21] = '\0';
        local_148[0x22] = '\0';
        local_148[0x23] = '\0';
        local_148[0x24] = '\0';
        local_148[0x25] = '\0';
        local_148[0x26] = '\0';
        local_148[0x27] = '\0';
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((pTVar18->m_buf[sVar14].m_type.type & DOC) != NOTYPE) {
        builtin_strncpy(local_148,"check failed: (!m_tree->is_doc(m_state->node_id))",0x32);
        if ((s_error_flags & 1) != 0) {
          bVar11 = is_debugger_attached();
          if (bVar11) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
        }
        local_f8 = 0;
        uStack_f0 = 0x789e;
        local_e8 = 0;
        pcStack_e0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_d8 = 0x65;
        auVar6 = ZEXT1224(ZEXT412(0x789e) << 0x40);
        LVar9.name.str._0_4_ = 0x1fdf9a;
        LVar9.super_LineCol.offset = auVar6._0_8_;
        LVar9.super_LineCol.line = auVar6._8_8_;
        LVar9.super_LineCol.col = auVar6._16_8_;
        LVar9.name.str._4_4_ = 0;
        LVar9.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  (local_148,0x32,LVar9,(this->m_stack).m_callbacks.m_user_data);
      }
      Tree::to_seq(this->m_tree,this->m_state->node_id,0);
    }
    else {
      if ((uVar20 == 0xffffffffffffffff) || (pTVar18->m_cap <= uVar20)) {
        if ((s_error_flags & 1) != 0) {
          bVar11 = is_debugger_attached();
          if (bVar11) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
        }
        local_148[0] = '\0';
        local_148[1] = '\0';
        local_148[2] = '\0';
        local_148[3] = '\0';
        local_148[4] = '\0';
        local_148[5] = '\0';
        local_148[6] = '\0';
        local_148[7] = '\0';
        local_148[8] = -0x7a;
        local_148[9] = 'K';
        local_148[10] = '\0';
        local_148[0xb] = '\0';
        local_148[0xc] = '\0';
        local_148[0xd] = '\0';
        local_148[0xe] = '\0';
        local_148[0xf] = '\0';
        local_148[0x10] = '\0';
        local_148[0x11] = '\0';
        local_148[0x12] = '\0';
        local_148[0x13] = '\0';
        local_148[0x14] = '\0';
        local_148[0x15] = '\0';
        local_148[0x16] = '\0';
        local_148[0x17] = '\0';
        local_148[0x18] = -0x66;
        local_148[0x19] = -0x21;
        local_148[0x1a] = '\x1f';
        local_148[0x1b] = '\0';
        local_148[0x1c] = '\0';
        local_148[0x1d] = '\0';
        local_148[0x1e] = '\0';
        local_148[0x1f] = '\0';
        local_148[0x20] = 'e';
        local_148[0x21] = '\0';
        local_148[0x22] = '\0';
        local_148[0x23] = '\0';
        local_148[0x24] = '\0';
        local_148[0x25] = '\0';
        local_148[0x26] = '\0';
        local_148[0x27] = '\0';
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((pTVar18->m_buf[uVar20].m_type.type & MAP) == NOTYPE) {
        builtin_strncpy(local_148 + 0x20,"rent_id))",10);
        builtin_strncpy(local_148 + 0x10,"_tree->is_map(pa",0x10);
        builtin_strncpy(local_148,"check failed: (m",0x10);
        if ((s_error_flags & 1) != 0) {
          bVar11 = is_debugger_attached();
          if (bVar11) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
        }
        local_d0 = 0;
        uStack_c8 = 0x788c;
        local_c0 = 0;
        pcStack_b8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_b0 = 0x65;
        auVar6 = ZEXT1224(ZEXT412(0x788c) << 0x40);
        LVar10.name.str._0_4_ = 0x1fdf9a;
        LVar10.super_LineCol.offset = auVar6._0_8_;
        LVar10.super_LineCol.line = auVar6._8_8_;
        LVar10.super_LineCol.col = auVar6._16_8_;
        LVar10.name.str._4_4_ = 0;
        LVar10.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  (local_148,0x2a,LVar10,(this->m_stack).m_callbacks.m_user_data);
      }
      uVar1 = this->m_state->flags;
      cVar23 = _consume_scalar(this);
      Tree::to_seq(this->m_tree,this->m_state->node_id,cVar23,(ulong)((uVar1 & 0x400) << 3));
      _write_key_anchor(this,this->m_state->node_id);
      pcVar16 = (this->m_key_tag).str;
      if (pcVar16 != (char *)0x0 && (this->m_key_tag).len != 0) {
        pTVar18 = this->m_tree;
        sVar14 = this->m_state->node_id;
        cVar23.len = (this->m_key_tag).len;
        cVar23.str = pcVar16;
        cVar23 = normalize_tag(cVar23);
        Tree::set_key_tag(pTVar18,sVar14,cVar23);
        (this->m_key_tag).str = (char *)0x0;
        (this->m_key_tag).len = 0;
      }
    }
    _write_val_anchor(this,this->m_state->node_id);
    uVar20 = this->m_state->node_id;
    pcVar16 = (this->m_state->line_contents).rem.str;
    pTVar18 = this->m_tree;
    if ((uVar20 != 0xffffffffffffffff) && (uVar20 < pTVar18->m_cap)) goto LAB_001d7a78;
    if ((s_error_flags & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
  }
  else {
    this->m_state->node_id = uVar20;
    pTVar18 = this->m_tree;
    if ((uVar20 == 0xffffffffffffffff) || (pTVar18->m_cap <= uVar20)) {
      if ((s_error_flags & 1) != 0) {
        bVar11 = is_debugger_attached();
        if (bVar11) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      local_148[0] = '\0';
      local_148[1] = '\0';
      local_148[2] = '\0';
      local_148[3] = '\0';
      local_148[4] = '\0';
      local_148[5] = '\0';
      local_148[6] = '\0';
      local_148[7] = '\0';
      local_148[8] = -0x7a;
      local_148[9] = 'K';
      local_148[10] = '\0';
      local_148[0xb] = '\0';
      local_148[0xc] = '\0';
      local_148[0xd] = '\0';
      local_148[0xe] = '\0';
      local_148[0xf] = '\0';
      local_148[0x10] = '\0';
      local_148[0x11] = '\0';
      local_148[0x12] = '\0';
      local_148[0x13] = '\0';
      local_148[0x14] = '\0';
      local_148[0x15] = '\0';
      local_148[0x16] = '\0';
      local_148[0x17] = '\0';
      local_148[0x18] = -0x66;
      local_148[0x19] = -0x21;
      local_148[0x1a] = '\x1f';
      local_148[0x1b] = '\0';
      local_148[0x1c] = '\0';
      local_148[0x1d] = '\0';
      local_148[0x1e] = '\0';
      local_148[0x1f] = '\0';
      local_148[0x20] = 'e';
      local_148[0x21] = '\0';
      local_148[0x22] = '\0';
      local_148[0x23] = '\0';
      local_148[0x24] = '\0';
      local_148[0x25] = '\0';
      local_148[0x26] = '\0';
      local_148[0x27] = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    NVar21 = (NodeType_e)((uint)pTVar18->m_buf[uVar20].m_type.type & 0x10);
    pTVar18 = this->m_tree;
    if ((uVar20 == 0xffffffffffffffff) || (pTVar18->m_cap <= uVar20)) {
      if ((s_error_flags & 1) != 0) {
        bVar11 = is_debugger_attached();
        if (bVar11) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      local_148[0] = '\0';
      local_148[1] = '\0';
      local_148[2] = '\0';
      local_148[3] = '\0';
      local_148[4] = '\0';
      local_148[5] = '\0';
      local_148[6] = '\0';
      local_148[7] = '\0';
      local_148[8] = -0x7a;
      local_148[9] = 'K';
      local_148[10] = '\0';
      local_148[0xb] = '\0';
      local_148[0xc] = '\0';
      local_148[0xd] = '\0';
      local_148[0xe] = '\0';
      local_148[0xf] = '\0';
      local_148[0x10] = '\0';
      local_148[0x11] = '\0';
      local_148[0x12] = '\0';
      local_148[0x13] = '\0';
      local_148[0x14] = '\0';
      local_148[0x15] = '\0';
      local_148[0x16] = '\0';
      local_148[0x17] = '\0';
      local_148[0x18] = -0x66;
      local_148[0x19] = -0x21;
      local_148[0x1a] = '\x1f';
      local_148[0x1b] = '\0';
      local_148[0x1c] = '\0';
      local_148[0x1d] = '\0';
      local_148[0x1e] = '\0';
      local_148[0x1f] = '\0';
      local_148[0x20] = 'e';
      local_148[0x21] = '\0';
      local_148[0x22] = '\0';
      local_148[0x23] = '\0';
      local_148[0x24] = '\0';
      local_148[0x25] = '\0';
      local_148[0x26] = '\0';
      local_148[0x27] = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    this_00 = this->m_tree;
    if ((pTVar18->m_buf[uVar20].m_type.type & SEQ) == NOTYPE) {
      bVar11 = Tree::has_children(this_00,uVar20);
      if (bVar11) {
        if ((s_error_flags & 1) != 0) {
          bVar11 = is_debugger_attached();
          if (bVar11) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
        }
        local_148[0] = '\0';
        local_148[1] = '\0';
        local_148[2] = '\0';
        local_148[3] = '\0';
        local_148[4] = '\0';
        local_148[5] = '\0';
        local_148[6] = '\0';
        local_148[7] = '\0';
        local_148[8] = -0x53;
        local_148[9] = 'x';
        local_148[10] = '\0';
        local_148[0xb] = '\0';
        local_148[0xc] = '\0';
        local_148[0xd] = '\0';
        local_148[0xe] = '\0';
        local_148[0xf] = '\0';
        local_148[0x10] = '\0';
        local_148[0x11] = '\0';
        local_148[0x12] = '\0';
        local_148[0x13] = '\0';
        local_148[0x14] = '\0';
        local_148[0x15] = '\0';
        local_148[0x16] = '\0';
        local_148[0x17] = '\0';
        local_148[0x18] = -0x66;
        local_148[0x19] = -0x21;
        local_148[0x1a] = '\x1f';
        local_148[0x1b] = '\0';
        local_148[0x1c] = '\0';
        local_148[0x1d] = '\0';
        local_148[0x1e] = '\0';
        local_148[0x1f] = '\0';
        local_148[0x20] = 'e';
        local_148[0x21] = '\0';
        local_148[0x22] = '\0';
        local_148[0x23] = '\0';
        local_148[0x24] = '\0';
        local_148[0x25] = '\0';
        local_148[0x26] = '\0';
        local_148[0x27] = '\0';
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: !m_tree->has_children(parent_id)",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      Tree::to_seq(this->m_tree,uVar20,NVar21);
    }
    else {
      if ((uVar20 == 0xffffffffffffffff) || (this_00->m_cap <= uVar20)) {
        if ((s_error_flags & 1) != 0) {
          bVar11 = is_debugger_attached();
          if (bVar11) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
        }
        local_148[0] = '\0';
        local_148[1] = '\0';
        local_148[2] = '\0';
        local_148[3] = '\0';
        local_148[4] = '\0';
        local_148[5] = '\0';
        local_148[6] = '\0';
        local_148[7] = '\0';
        local_148[8] = -0x7d;
        local_148[9] = 'K';
        local_148[10] = '\0';
        local_148[0xb] = '\0';
        local_148[0xc] = '\0';
        local_148[0xd] = '\0';
        local_148[0xe] = '\0';
        local_148[0xf] = '\0';
        local_148[0x10] = '\0';
        local_148[0x11] = '\0';
        local_148[0x12] = '\0';
        local_148[0x13] = '\0';
        local_148[0x14] = '\0';
        local_148[0x15] = '\0';
        local_148[0x16] = '\0';
        local_148[0x17] = '\0';
        local_148[0x18] = -0x66;
        local_148[0x19] = -0x21;
        local_148[0x1a] = '\x1f';
        local_148[0x1b] = '\0';
        local_148[0x1c] = '\0';
        local_148[0x1d] = '\0';
        local_148[0x1e] = '\0';
        local_148[0x1f] = '\0';
        local_148[0x20] = 'e';
        local_148[0x21] = '\0';
        local_148[0x22] = '\0';
        local_148[0x23] = '\0';
        local_148[0x24] = '\0';
        local_148[0x25] = '\0';
        local_148[0x26] = '\0';
        local_148[0x27] = '\0';
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      pNVar19 = this_00->m_buf;
      NVar21 = NVar21 | pNVar19[uVar20].m_type.type;
      Tree::_check_next_flags(this_00,uVar20,NVar21);
      pNVar19[uVar20].m_type.type = NVar21;
    }
    _move_scalar_from_top(this);
    _write_val_anchor(this,uVar20);
    pcVar16 = (this->m_state->line_contents).rem.str;
    pTVar18 = this->m_tree;
    if ((uVar20 != 0xffffffffffffffff) && (uVar20 < pTVar18->m_cap)) goto LAB_001d7a78;
    if ((s_error_flags & 1) != 0) {
      bVar11 = is_debugger_attached();
      if (bVar11) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
  }
  local_148[0] = '\0';
  local_148[1] = '\0';
  local_148[2] = '\0';
  local_148[3] = '\0';
  local_148[4] = '\0';
  local_148[5] = '\0';
  local_148[6] = '\0';
  local_148[7] = '\0';
  local_148[8] = -0x7d;
  local_148[9] = 'K';
  local_148[10] = '\0';
  local_148[0xb] = '\0';
  local_148[0xc] = '\0';
  local_148[0xd] = '\0';
  local_148[0xe] = '\0';
  local_148[0xf] = '\0';
  local_148[0x10] = '\0';
  local_148[0x11] = '\0';
  local_148[0x12] = '\0';
  local_148[0x13] = '\0';
  local_148[0x14] = '\0';
  local_148[0x15] = '\0';
  local_148[0x16] = '\0';
  local_148[0x17] = '\0';
  local_148[0x18] = -0x66;
  local_148[0x19] = -0x21;
  local_148[0x1a] = '\x1f';
  local_148[0x1b] = '\0';
  local_148[0x1c] = '\0';
  local_148[0x1d] = '\0';
  local_148[0x1e] = '\0';
  local_148[0x1f] = '\0';
  local_148[0x20] = 'e';
  local_148[0x21] = '\0';
  local_148[0x22] = '\0';
  local_148[0x23] = '\0';
  local_148[0x24] = '\0';
  local_148[0x25] = '\0';
  local_148[0x26] = '\0';
  local_148[0x27] = '\0';
  (*(code *)PTR_error_impl_00240518)
            ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
             (anonymous_namespace)::s_default_callbacks);
LAB_001d7a78:
  pTVar18->m_buf[uVar20].m_val.scalar.str = pcVar16;
  pcVar16 = (this->m_val_tag).str;
  if (pcVar16 != (char *)0x0 && (this->m_val_tag).len != 0) {
    pTVar18 = this->m_tree;
    sVar14 = this->m_state->node_id;
    tag.len = (this->m_val_tag).len;
    tag.str = pcVar16;
    cVar23 = normalize_tag(tag);
    Tree::set_val_tag(pTVar18,sVar14,cVar23);
    (this->m_val_tag).str = (char *)0x0;
    (this->m_val_tag).len = 0;
  }
  return;
}

Assistant:

void Parser::_start_seq(bool as_child)
{
    _c4dbgpf("start_seq (as child={})", as_child);
    if(has_all(RTOP|RUNK))
    {
        _c4dbgpf("start_seq: moving key tag to val tag: '{}'", m_key_tag);
        m_val_tag = m_key_tag;
        m_key_tag.clear();
    }
    addrem_flags(RSEQ|RVAL, RUNK);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_stack.bottom()) == node(m_root_id));
    size_t parent_id = m_stack.size() < 2 ? m_root_id : m_stack.top(1).node_id;
    _RYML_CB_ASSERT(m_stack.m_callbacks, parent_id != NONE);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_state) == nullptr || node(m_state) == node(m_root_id));
    if(as_child)
    {
        m_state->node_id = m_tree->append_child(parent_id);
        if(has_all(SSCL))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_map(parent_id));
            type_bits key_quoted = 0;
            if(m_state->flags & QSCL) // before consuming the scalar
                key_quoted |= KEYQUO;
            csubstr key = _consume_scalar();
            m_tree->to_seq(m_state->node_id, key, key_quoted);
            _c4dbgpf("start_seq: id={} name='{}'", m_state->node_id, m_tree->key(m_state->node_id));
            _write_key_anchor(m_state->node_id);
            if( ! m_key_tag.empty())
            {
                _c4dbgpf("start_seq[{}]: set key tag='{}' -> '{}'", m_state->node_id, m_key_tag, normalize_tag(m_key_tag));
                m_tree->set_key_tag(m_state->node_id, normalize_tag(m_key_tag));
                m_key_tag.clear();
            }
        }
        else
        {
            type_bits as_doc = 0;
            _RYML_CB_ASSERT(m_stack.m_callbacks, !m_tree->is_doc(m_state->node_id));
            m_tree->to_seq(m_state->node_id, as_doc);
            _c4dbgpf("start_seq: id={}{}", m_state->node_id, as_doc ? " as doc" : "");
        }
        _write_val_anchor(m_state->node_id);
        m_tree->_p(m_state->node_id)->m_val.scalar.str = m_state->line_contents.rem.str;
    }
    else
    {
        m_state->node_id = parent_id;
        type_bits as_doc = 0;
        if(m_tree->is_doc(m_state->node_id))
            as_doc |= DOC;
        if(!m_tree->is_seq(parent_id))
        {
            RYML_CHECK(!m_tree->has_children(parent_id));
            m_tree->to_seq(parent_id, as_doc);
        }
        else
        {
            m_tree->_add_flags(parent_id, as_doc);
        }
        _move_scalar_from_top();
        _c4dbgpf("start_seq: id={}{}", m_state->node_id, as_doc ? " as_doc" : "");
        _write_val_anchor(parent_id);
        m_tree->_p(parent_id)->m_val.scalar.str = m_state->line_contents.rem.str;
    }
    if( ! m_val_tag.empty())
    {
        _c4dbgpf("start_seq[{}]: set val tag='{}' -> '{}'", m_state->node_id, m_val_tag, normalize_tag(m_val_tag));
        m_tree->set_val_tag(m_state->node_id, normalize_tag(m_val_tag));
        m_val_tag.clear();
    }
}